

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.h
# Opt level: O0

optional<cmMakefileProfilingData::RAII> __thiscall
cmake::
CreateProfilingEntry<GeneratorExpressionContent::Evaluate[abi:cxx11](cmGeneratorExpressionContext*,cmGeneratorExpressionDAGChecker*)const::__0>
          (cmake *this,string *category,string *name,anon_class_8_1_b8d00ba8 *argsFunc)

{
  anon_class_8_1_b8d00ba8 *__args_3;
  string *__args_2;
  bool bVar1;
  cmMakefileProfilingData *__args_1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  anon_class_8_1_b8d00ba8 *in_R8;
  optional<cmMakefileProfilingData::RAII> oVar3;
  Value local_58;
  anon_class_8_1_b8d00ba8 *local_30;
  anon_class_8_1_b8d00ba8 *argsFunc_local;
  string *name_local;
  string *category_local;
  cmake *this_local;
  
  local_30 = in_R8;
  argsFunc_local = argsFunc;
  name_local = name;
  category_local = category;
  this_local = this;
  bVar1 = IsProfilingEnabled((cmake *)category);
  if (bVar1) {
    __args_1 = GetProfilingOutput((cmake *)category);
    __args_2 = name_local;
    __args_3 = argsFunc_local;
    GeneratorExpressionContent::Evaluate::anon_class_8_1_b8d00ba8::operator()(&local_58,local_30);
    std::
    make_optional<cmMakefileProfilingData::RAII,cmMakefileProfilingData&,std::__cxx11::string_const&,std::__cxx11::string_const&,Json::Value>
              ((cmMakefileProfilingData *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args_1,
               __args_2,(Value *)__args_3);
    Json::Value::~Value(&local_58);
    uVar2 = extraout_RDX;
  }
  else {
    std::optional<cmMakefileProfilingData::RAII>::optional
              ((optional<cmMakefileProfilingData::RAII> *)this);
    uVar2 = extraout_RDX_00;
  }
  oVar3.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
  super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._8_8_ = uVar2;
  oVar3.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
  super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
  super__Optional_payload_base<cmMakefileProfilingData::RAII>._M_payload =
       (_Storage<cmMakefileProfilingData::RAII,_false>)this;
  return (optional<cmMakefileProfilingData::RAII>)
         oVar3.super__Optional_base<cmMakefileProfilingData::RAII,_false,_false>._M_payload.
         super__Optional_payload<cmMakefileProfilingData::RAII,_true,_false,_false>.
         super__Optional_payload_base<cmMakefileProfilingData::RAII>;
}

Assistant:

cm::optional<cmMakefileProfilingData::RAII> CreateProfilingEntry(
    const std::string& category, const std::string& name, ArgsFunc&& argsFunc)
  {
    if (this->IsProfilingEnabled()) {
      return cm::make_optional<cmMakefileProfilingData::RAII>(
        this->GetProfilingOutput(), category, name, argsFunc());
    }
    return cm::nullopt;
  }